

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

void __thiscall kratos::Context::add_hash(Context *this,Generator *generator,uint64_t hash)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar4 [16];
  string_view format_str;
  format_args args;
  string local_d0;
  _Node_iterator_base<std::pair<const_kratos::Generator_*const,_unsigned_long>,_false> local_b0;
  _Node_iterator_base<std::pair<const_kratos::Generator_*const,_unsigned_long>,_false> local_a8;
  mapped_type local_a0;
  uint64_t hash_local;
  Generator *generator_local;
  Context *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a0 = hash;
  hash_local = (uint64_t)generator;
  generator_local = (Generator *)this;
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<const_kratos::Generator_*,_unsigned_long,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>_>
       ::find(&this->generator_hash_,(key_type *)&hash_local);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<const_kratos::Generator_*,_unsigned_long,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>_>
       ::end(&this->generator_hash_);
  bVar2 = std::__detail::operator!=(&local_a8,&local_b0);
  mVar1 = local_a0;
  if (!bVar2) {
    pmVar3 = std::
             unordered_map<const_kratos::Generator_*,_unsigned_long,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>_>
             ::operator[](&this->generator_hash_,(key_type *)&hash_local);
    *pmVar3 = mVar1;
    return;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(hash_local + 0x78);
  local_38 = &local_d0;
  local_40 = "{0}\'s hash has already been computed";
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string_const&,char[37],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"{0}\'s hash has already been computed",(v7 *)vargs,auVar4._8_8_,
                  (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                  "{0}\'s hash has already been computed");
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_78.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_d0,(detail *)local_78.data_,format_str,args);
  InternalException::InternalException(auVar4._0_8_,&local_d0);
  __cxa_throw(auVar4._0_8_,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void Context::add_hash(const Generator *generator, uint64_t hash) {
    if (generator_hash_.find(generator) != generator_hash_.end())
        throw InternalException(::format("{0}'s hash has already been computed", generator->name));
    generator_hash_[generator] = hash;
}